

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

void __thiscall QGraphicsWidget::setPalette(QGraphicsWidget *this,QPalette *palette)

{
  QGraphicsWidgetPrivate *this_00;
  long lVar1;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  _func_int **local_38;
  Data *pDStack_30;
  ExtraStruct *local_28;
  
  local_28 = *(ExtraStruct **)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
  lVar1 = QPalette::resolveMask();
  setAttribute(this,WA_SetPalette,lVar1 != 0);
  local_38 = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  pDStack_30 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QGraphicsWidgetPrivate::naturalWidgetPalette((QGraphicsWidgetPrivate *)&stack0xffffffffffffffc8);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::resolve((QPalette *)local_48);
  QGraphicsWidgetPrivate::setPalette_helper(this_00,(QPalette *)local_48);
  QPalette::~QPalette((QPalette *)local_48);
  QPalette::~QPalette((QPalette *)&stack0xffffffffffffffc8);
  if (*(ExtraStruct **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::setPalette(const QPalette &palette)
{
    Q_D(QGraphicsWidget);
    setAttribute(Qt::WA_SetPalette, palette.resolveMask() != 0);

    QPalette naturalPalette = d->naturalWidgetPalette();
    QPalette resolvedPalette = palette.resolve(naturalPalette);
    d->setPalette_helper(resolvedPalette);
}